

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O2

void __thiscall
btBox2dShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btBox2dShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  btScalar bVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)numVectors;
  if (numVectors < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    bVar1 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
            m_implicitShapeDimensions.m_floats[2];
    uVar5 = -(uint)(0.0 <= *(float *)((long)vectors->m_floats + uVar3 + 8));
    uVar2 = *(undefined8 *)((long)vectors->m_floats + uVar3);
    uVar6 = -(uint)(0.0 <= (float)uVar2);
    uVar7 = -(uint)(0.0 <= (float)((ulong)uVar2 >> 0x20));
    uVar2 = *(undefined8 *)
             (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
             m_implicitShapeDimensions.m_floats;
    uVar8 = (uint)uVar2;
    uVar9 = (uint)((ulong)uVar2 >> 0x20);
    *(ulong *)((long)supportVerticesOut->m_floats + uVar3) =
         CONCAT44(~uVar7 & (uVar9 ^ 0x80000000),~uVar6 & (uVar8 ^ 0x80000000)) |
         CONCAT44(uVar9 & uVar7,uVar8 & uVar6);
    *(uint *)((long)supportVerticesOut->m_floats + uVar3 + 8) =
         ~uVar5 & (uint)-bVar1 | uVar5 & (uint)bVar1;
    *(undefined4 *)((long)supportVerticesOut->m_floats + uVar3 + 0xc) = 0;
  }
  return;
}

Assistant:

virtual void	batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
	{
		const btVector3& halfExtents = getHalfExtentsWithoutMargin();
	
		for (int i=0;i<numVectors;i++)
		{
			const btVector3& vec = vectors[i];
			supportVerticesOut[i].setValue(btFsels(vec.x(), halfExtents.x(), -halfExtents.x()),
				btFsels(vec.y(), halfExtents.y(), -halfExtents.y()),
				btFsels(vec.z(), halfExtents.z(), -halfExtents.z())); 
		}

	}